

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  long *plVar1;
  ulong *puVar2;
  TestError *this_00;
  size_type *psVar3;
  string shader_source;
  string example_structure_object;
  string example_structure_definition;
  long *local_f0 [2];
  long local_e0 [2];
  string local_d0;
  string local_b0;
  long *local_90 [2];
  long local_80 [2];
  string base_variable_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  example_structure_definition._M_dataplus._M_p = (pointer)&example_structure_definition.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&example_structure_definition,
             "struct light {\n    float intensity;\n    int position;\n};\n","");
  example_structure_object._M_dataplus._M_p = (pointer)&example_structure_object.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&example_structure_object,"    light my_light_variable","");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,example_structure_object._M_dataplus._M_p,
             example_structure_object._M_dataplus._M_p + example_structure_object._M_string_length);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"[]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&base_variable_string,this,local_f0,(string *)local_90,2);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  std::__cxx11::string::append((char *)&base_variable_string);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"light","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.0, 2","");
  recursively_initialise(&shader_source,this,&local_b0,2,&local_d0);
  std::__cxx11::string::_M_append
            ((char *)&base_variable_string,(ulong)shader_source._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&base_variable_string);
  std::operator+(&local_50,&example_structure_definition,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &shader_start_abi_cxx11_);
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)base_variable_string._M_dataplus._M_p);
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((size_type *)*plVar1 == psVar3) {
    shader_source.field_2._M_allocated_capacity = *psVar3;
    shader_source.field_2._8_8_ = plVar1[3];
  }
  else {
    shader_source.field_2._M_allocated_capacity = *psVar3;
    shader_source._M_dataplus._M_p = (pointer)*plVar1;
  }
  shader_source._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  puVar2 = &set_tesseation_abi_cxx11_;
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    break;
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 3:
    puVar2 = &emit_quad_abi_cxx11_;
  case 4:
    std::__cxx11::string::_M_append((char *)&shader_source,*puVar2);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x9fe);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
  (*(code *)(&DAT_01aca5ac + *(int *)(&DAT_01aca5ac + (ulong)tested_shader_type * 4)))
            (&DAT_01aca5ac + *(int *)(&DAT_01aca5ac + (ulong)tested_shader_type * 4),
             empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
             empty_string_abi_cxx11_,empty_string_abi_cxx11_);
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclStructConstructors<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_structure_definition("struct light {\n"
											 "    float intensity;\n"
											 "    int position;\n"
											 "};\n");
	std::string example_structure_object("    light my_light_variable");

	for (size_t max_dimension_index = 2; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string base_variable_string = this->extend_string(example_structure_object, "[]", max_dimension_index);
		base_variable_string += " = ";
		base_variable_string += recursively_initialise("light", max_dimension_index, "1.0, 2");
		base_variable_string += ";\n\n";

		std::string shader_source = example_structure_definition + shader_start + base_variable_string;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 2; ...) */
}